

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_cmp.c
# Opt level: O0

int check_suite_b(EVP_PKEY *pkey,int sign_nid,unsigned_long *pflags)

{
  int iVar1;
  ulong *in_RDX;
  int in_ESI;
  long in_RDI;
  int curve_nid;
  size_t curve_name_len;
  char curve_name [80];
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  EVP_PKEY *in_stack_ffffffffffffff88;
  EVP_PKEY *in_stack_ffffffffffffff90;
  int local_4;
  
  if ((in_RDI == 0) ||
     (iVar1 = EVP_PKEY_is_a(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80), iVar1 == 0)) {
    local_4 = 0x39;
  }
  else {
    iVar1 = EVP_PKEY_get_group_name
                      (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
                       (size_t)in_stack_ffffffffffffff80,
                       (size_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (iVar1 == 0) {
      local_4 = 0x3a;
    }
    else {
      iVar1 = OBJ_txt2nid(&stack0xffffffffffffff88);
      if (iVar1 == 0x2cb) {
        if ((in_ESI != -1) && (in_ESI != 0x31b)) {
          return 0x3b;
        }
        if ((*in_RDX & 0x20000) == 0) {
          return 0x3c;
        }
        *in_RDX = *in_RDX & 0xfffffffffffeffff;
      }
      else {
        if (iVar1 != 0x19f) {
          return 0x3a;
        }
        if ((in_ESI != -1) && (in_ESI != 0x31a)) {
          return 0x3b;
        }
        if ((*in_RDX & 0x10000) == 0) {
          return 0x3c;
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int check_suite_b(EVP_PKEY *pkey, int sign_nid, unsigned long *pflags)
{
    char curve_name[80];
    size_t curve_name_len;
    int curve_nid;

    if (pkey == NULL || !EVP_PKEY_is_a(pkey, "EC"))
        return X509_V_ERR_SUITE_B_INVALID_ALGORITHM;

    if (!EVP_PKEY_get_group_name(pkey, curve_name, sizeof(curve_name),
                                 &curve_name_len))
        return X509_V_ERR_SUITE_B_INVALID_CURVE;

    curve_nid = OBJ_txt2nid(curve_name);
    /* Check curve is consistent with LOS */
    if (curve_nid == NID_secp384r1) { /* P-384 */
        /*
         * Check signature algorithm is consistent with curve.
         */
        if (sign_nid != -1 && sign_nid != NID_ecdsa_with_SHA384)
            return X509_V_ERR_SUITE_B_INVALID_SIGNATURE_ALGORITHM;
        if (!(*pflags & X509_V_FLAG_SUITEB_192_LOS))
            return X509_V_ERR_SUITE_B_LOS_NOT_ALLOWED;
        /* If we encounter P-384 we cannot use P-256 later */
        *pflags &= ~X509_V_FLAG_SUITEB_128_LOS_ONLY;
    } else if (curve_nid == NID_X9_62_prime256v1) { /* P-256 */
        if (sign_nid != -1 && sign_nid != NID_ecdsa_with_SHA256)
            return X509_V_ERR_SUITE_B_INVALID_SIGNATURE_ALGORITHM;
        if (!(*pflags & X509_V_FLAG_SUITEB_128_LOS_ONLY))
            return X509_V_ERR_SUITE_B_LOS_NOT_ALLOWED;
    } else {
        return X509_V_ERR_SUITE_B_INVALID_CURVE;
    }
    return X509_V_OK;
}